

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O1

int idaNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector del,sunrealtype tol,N_Vector ewt,
                  void *ida_mem)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int m;
  int local_2c;
  double local_28;
  sunrealtype local_20;
  
  if (ida_mem == (void *)0x0) {
    iVar2 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x150,"idaNlsConvTest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    local_20 = tol;
    local_28 = (double)N_VWrmsNorm(del,ewt);
    iVar1 = SUNNonlinSolGetCurIter(NLS,&local_2c);
    iVar2 = -0x14;
    if (iVar1 == 0) {
      if (local_2c == 0) {
        *(double *)((long)ida_mem + 0x530) = local_28;
        if (local_28 <= *(double *)((long)ida_mem + 0x548) * 0.0001) {
          return 0;
        }
      }
      else {
        dVar3 = (double)SUNRpowerR(local_28 / *(double *)((long)ida_mem + 0x530),
                                   1.0 / (double)local_2c);
        if (0.9 < dVar3) {
          return 0x386;
        }
        *(double *)((long)ida_mem + 0x528) = dVar3 / (1.0 - dVar3);
      }
      iVar2 = 0x385;
      if (*(double *)((long)ida_mem + 0x528) * local_28 <= local_20) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int idaNlsConvTest(SUNNonlinearSolver NLS,
                          SUNDIALS_MAYBE_UNUSED N_Vector ycor, N_Vector del,
                          sunrealtype tol, N_Vector ewt, void* ida_mem)
{
  IDAMem IDA_mem;
  int m, retval;
  sunrealtype delnrm;
  sunrealtype rate;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != IDA_SUCCESS) { return (IDA_MEM_NULL); }

  /* test for convergence, first directly, then with rate estimate. */
  if (m == 0)
  {
    IDA_mem->ida_oldnrm = delnrm;
    if (delnrm <= PT0001 * IDA_mem->ida_toldel) { return (SUN_SUCCESS); }
  }
  else
  {
    rate = SUNRpowerR(delnrm / IDA_mem->ida_oldnrm, ONE / m);
    if (rate > RATEMAX) { return (SUN_NLS_CONV_RECVR); }
    IDA_mem->ida_ss = rate / (ONE - rate);
  }

  if (IDA_mem->ida_ss * delnrm <= tol) { return (SUN_SUCCESS); }

  /* not yet converged */
  return (SUN_NLS_CONTINUE);
}